

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  bool bVar1;
  cmMakefile *this_00;
  cmSwiftCompileMode *pcVar2;
  string *psVar3;
  ulong uVar4;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  allocator<char> local_119;
  string local_118;
  cmValue local_f8;
  cmValue flag_1;
  string local_e8;
  cmValue local_c8;
  cmValue flag;
  string swiftCompileModeFlag;
  optional<cmSwiftCompileMode> swiftCompileMode;
  cmMakefile *mf;
  string compileFlags;
  string *arch_local;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *flags;
  
  compileFlags.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&mf);
  this_00 = GetMakefile(this);
  AddLanguageFlags(this,(string *)&mf,target,Compile,lang,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    AppendFeatureOptions(this,(string *)&mf,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)&mf,target,lang,config,arch);
  bVar1 = std::operator==(lang,"Fortran");
  if (bVar1) {
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0x11])
              (&swiftCompileMode,this,target,config);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,&mf,&swiftCompileMode);
    std::__cxx11::string::~string((string *)&swiftCompileMode);
  }
  else {
    bVar1 = std::operator==(lang,"Swift");
    if (bVar1) {
      swiftCompileModeFlag.field_2._8_8_ = GetSwiftCompileMode(this,target,config);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)(swiftCompileModeFlag.field_2._M_local_buf + 8));
      if (bVar1) {
        std::__cxx11::string::string((string *)&flag);
        pcVar2 = std::optional<cmSwiftCompileMode>::operator*
                           ((optional<cmSwiftCompileMode> *)
                            ((long)&swiftCompileModeFlag.field_2 + 8));
        switch(*pcVar2) {
        case Wholemodule:
          std::__cxx11::string::operator=((string *)&flag,"-wmo");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"CMAKE_Swift_COMPILE_OPTIONS_WMO",&local_119);
          local_f8 = cmMakefile::GetDefinition(this_00,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          bVar1 = cmValue::operator_cast_to_bool(&local_f8);
          if (bVar1) {
            psVar3 = cmValue::operator*[abi_cxx11_(&local_f8);
            std::__cxx11::string::operator=((string *)&flag,(string *)psVar3);
          }
          break;
        case Incremental:
          std::__cxx11::string::operator=((string *)&flag,"-incremental");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL",
                     (allocator<char> *)((long)&flag_1.Value + 7));
          local_c8 = cmMakefile::GetDefinition(this_00,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&flag_1.Value + 7));
          bVar1 = cmValue::operator_cast_to_bool(&local_c8);
          if (bVar1) {
            psVar3 = cmValue::operator*[abi_cxx11_(&local_c8);
            std::__cxx11::string::operator=((string *)&flag,(string *)psVar3);
          }
          break;
        case Singlefile:
          break;
        case Unknown:
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          cmStrCat<char_const(&)[43],std::__cxx11::string_const&,char_const(&)[2]>
                    (&local_140,(char (*) [43])"Unknown Swift_COMPILATION_MODE on target \'",psVar3,
                     (char (*) [2])0x116b6f6);
          IssueMessage(this,AUTHOR_WARNING,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,&mf,&flag);
        std::__cxx11::string::~string((string *)&flag);
      }
    }
  }
  AddCMP0018Flags(this,(string *)&mf,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)&mf,target,lang);
  AddColorDiagnosticsFlags(this,(string *)&mf,lang);
  cmMakefile::GetDefineFlags_abi_cxx11_(&local_160,this_00);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,&mf,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  GetFrameworkFlags(&local_180,this,lang,config,target);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,&mf,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  GetXcFrameworkFlags(&local_1a0,this,lang,config,target);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,&mf,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf);
  }
  AddCompileOptions(this,__return_storage_ptr__,target,lang,config);
  compileFlags.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&mf);
  if ((compileFlags.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  } else if (lang == "Swift") {
    // Only set the compile mode if CMP0157 is set
    if (cm::optional<cmSwiftCompileMode> swiftCompileMode =
          this->GetSwiftCompileMode(target, config)) {
      std::string swiftCompileModeFlag;
      switch (*swiftCompileMode) {
        case cmSwiftCompileMode::Incremental: {
          swiftCompileModeFlag = "-incremental";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Wholemodule: {
          swiftCompileModeFlag = "-wmo";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_WMO")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Singlefile:
          break;
        case cmSwiftCompileMode::Unknown: {
          this->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("Unknown Swift_COMPILATION_MODE on target '",
                     target->GetName(), "'"));
        }
      }
      this->AppendFlags(compileFlags, swiftCompileModeFlag);
    }
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));
  this->AppendFlags(compileFlags,
                    this->GetXcFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}